

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::IsDivisibleBy
          (MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  bool bVar1;
  const_iterator this_00;
  MM<135UL> *in_RDI;
  const_iterator iter;
  list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *in_stack_ffffffffffffffc8;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    this_00 = std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::end
                        (in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_20,(_Self *)&stack0xffffffffffffffd8);
    if (!bVar1) {
      return true;
    }
    std::_List_const_iterator<GF2::MM<135UL>_>::operator->
              ((_List_const_iterator<GF2::MM<135UL>_> *)0x17c430);
    bVar1 = MM<135UL>::IsDivisibleBy((MM<135UL> *)this_00._M_node,in_RDI);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<135UL>_>::operator++(local_20);
  }
  return false;
}

Assistant:

bool IsDivisibleBy(const MM<_n>& mRight) const
	{
		for (const_iterator iter = begin(); iter != end(); ++iter)
			if (!iter->IsDivisibleBy(mRight))
				return false;
		return true;
	}